

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.cc
# Opt level: O2

void __thiscall Vector::Vector(Vector *this,Type *on)

{
  ulong uVar1;
  allocator local_79;
  string local_78;
  string local_58;
  string local_38 [32];
  
  *(undefined ***)this = &PTR__Vector_0010f8a8;
  std::__cxx11::string::string(local_38,"/std/vector",&local_79);
  Typelib::Type::getName_abi_cxx11_();
  fullName(&local_58,&local_78);
  uVar1 = (**(code **)(*(long *)this + 0xc0))(this);
  Typelib::Container::Container(&this->super_Container,local_38,(string *)&local_58,uVar1,on);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string(local_38);
  *(undefined ***)this = &PTR__Vector_0010f8a8;
  getElementLayout(&this->element_layout,on);
  return;
}

Assistant:

Vector::Vector(Type const& on)
    : Container("/std/vector", fullName(on.getName()), getNaturalSize(), on)
    , element_layout(getElementLayout(on))
{
}